

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cwebp.c
# Opt level: O0

void PrintMapInfo(WebPPicture *pic)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long in_RDI;
  int c;
  int y;
  int x;
  int type;
  int mb_h;
  int mb_w;
  int local_1c;
  int local_18;
  
  if (*(long *)(in_RDI + 0x78) != 0) {
    iVar3 = (*(int *)(in_RDI + 8) + 0xf) / 0x10;
    iVar1 = *(int *)(in_RDI + 0xc);
    iVar2 = *(int *)(in_RDI + 0x70);
    for (local_1c = 0; local_1c < (iVar1 + 0xf) / 0x10; local_1c = local_1c + 1) {
      for (local_18 = 0; local_18 < iVar3; local_18 = local_18 + 1) {
        uVar4 = (uint)*(byte *)(*(long *)(in_RDI + 0x78) + (long)(local_18 + local_1c * iVar3));
        if (iVar2 == 1) {
          fprintf(_stderr,"%c",(ulong)(uint)(int)"+."[(int)uVar4]);
        }
        else if (iVar2 == 2) {
          fprintf(_stderr,"%c",(ulong)(uint)(int)".-*X"[(int)uVar4]);
        }
        else if (iVar2 == 3) {
          fprintf(_stderr,"%.2d ",(ulong)uVar4);
        }
        else if ((iVar2 == 6) || (iVar2 == 7)) {
          fprintf(_stderr,"%3d ",(ulong)uVar4);
        }
        else {
          fprintf(_stderr,"0x%.2x ",(ulong)uVar4);
        }
      }
      fprintf(_stderr,"\n");
    }
  }
  return;
}

Assistant:

static void PrintMapInfo(const WebPPicture* const pic) {
  if (pic->extra_info != NULL) {
    const int mb_w = (pic->width + 15) / 16;
    const int mb_h = (pic->height + 15) / 16;
    const int type = pic->extra_info_type;
    int x, y;
    for (y = 0; y < mb_h; ++y) {
      for (x = 0; x < mb_w; ++x) {
        const int c = pic->extra_info[x + y * mb_w];
        if (type == 1) {   // intra4/intra16
          fprintf(stderr, "%c", "+."[c]);
        } else if (type == 2) {    // segments
          fprintf(stderr, "%c", ".-*X"[c]);
        } else if (type == 3) {    // quantizers
          fprintf(stderr, "%.2d ", c);
        } else if (type == 6 || type == 7) {
          fprintf(stderr, "%3d ", c);
        } else {
          fprintf(stderr, "0x%.2x ", c);
        }
      }
      fprintf(stderr, "\n");
    }
  }
}